

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O2

string_view __thiscall csv::CSVRow::get_field(CSVRow *this,size_t index)

{
  ParseFlags PVar1;
  element_type *peVar2;
  byte bVar3;
  RawCSVField *pRVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  runtime_error *this_00;
  char *pcVar7;
  size_t i;
  ulong uVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view sVar10;
  size_t field_index;
  basic_string_view<char,_std::char_traits<char>_> field_str;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  
  if (index < this->row_length) {
    field_index = index + this->fields_start;
    pRVar4 = internals::CSVFieldList::operator[]
                       (&((this->data).
                          super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->fields,field_index);
    peVar2 = (this->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_48._M_len = (peVar2->data)._M_len;
    local_48._M_str = (peVar2->data)._M_str;
    field_str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_48,pRVar4->start + this->data_start,0xffffffffffffffff);
    pcVar7 = field_str._M_str;
    if (pRVar4->has_double_quote == true) {
      pmVar5 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&((this->data).
                                 super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->double_quote_fields,&field_index);
      sVar6 = pmVar5->_M_string_length;
      if (sVar6 == 0) {
        bVar3 = 0;
        for (uVar8 = 0; uVar8 < pRVar4->length; uVar8 = uVar8 + 1) {
          PVar1 = (((this->data).
                    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->parse_flags)._M_elems[(long)pcVar7[uVar8] + 0x80];
          if ((bool)(PVar1 == QUOTE & bVar3)) {
            bVar3 = 0;
          }
          else {
            bVar3 = PVar1 == QUOTE | bVar3;
            std::__cxx11::string::push_back((char)pmVar5);
          }
        }
        sVar6 = pmVar5->_M_string_length;
      }
      bVar9._M_str = (pmVar5->_M_dataplus)._M_p;
      bVar9._M_len = sVar6;
    }
    else {
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&field_str,0,pRVar4->length);
    }
    sVar10._M_len = bVar9._M_len;
    sVar10._M_str = bVar9._M_str;
    return sVar10;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Index out of bounds.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CSV_INLINE csv::string_view CSVRow::get_field(size_t index) const
    {
        using internals::ParseFlags;

        if (index >= this->size())
            throw std::runtime_error("Index out of bounds.");

        const size_t field_index = this->fields_start + index;
        auto& field = this->data->fields[field_index];
        auto field_str = csv::string_view(this->data->data).substr(this->data_start + field.start);

        if (field.has_double_quote) {
            auto& value = this->data->double_quote_fields[field_index];
            if (value.empty()) {
                bool prev_ch_quote = false;
                for (size_t i = 0; i < field.length; i++) {
                    if (this->data->parse_flags[field_str[i] + 128] == ParseFlags::QUOTE) {
                        if (prev_ch_quote) {
                            prev_ch_quote = false;
                            continue;
                        }
                        else {
                            prev_ch_quote = true;
                        }
                    }

                    value += field_str[i];
                }
            }

            return csv::string_view(value);
        }

        return field_str.substr(0, field.length);
    }